

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_reader.cpp
# Opt level: O3

unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> __thiscall
duckdb::CreateDecimalReaderInternal<true>
          (duckdb *this,ParquetReader *reader,ParquetColumnSchema *schema)

{
  ColumnReader *this_00;
  undefined *puVar1;
  InternalException *this_01;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  switch(schema->field_0x29) {
  case 5:
    this_00 = (ColumnReader *)operator_new(0x200);
    ColumnReader::ColumnReader(this_00,reader,schema);
    this_00[1]._vptr_ColumnReader = (_func_int **)0x0;
    this_00[1].column_schema = (ParquetColumnSchema *)0x0;
    puVar1 = &DecimalColumnReader<short,true>::vtable;
    break;
  case 6:
  case 8:
  case 10:
  case 0xb:
switchD_00335915_caseD_6:
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"Unrecognized type for Decimal","");
    duckdb::InternalException::InternalException(this_01,(string *)local_48);
    __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  case 7:
    this_00 = (ColumnReader *)operator_new(0x200);
    ColumnReader::ColumnReader(this_00,reader,schema);
    this_00[1]._vptr_ColumnReader = (_func_int **)0x0;
    this_00[1].column_schema = (ParquetColumnSchema *)0x0;
    puVar1 = &DecimalColumnReader<int,true>::vtable;
    break;
  case 9:
    this_00 = (ColumnReader *)operator_new(0x200);
    ColumnReader::ColumnReader(this_00,reader,schema);
    this_00[1]._vptr_ColumnReader = (_func_int **)0x0;
    this_00[1].column_schema = (ParquetColumnSchema *)0x0;
    puVar1 = &DecimalColumnReader<long,true>::vtable;
    break;
  case 0xc:
    this_00 = (ColumnReader *)operator_new(0x200);
    ColumnReader::ColumnReader(this_00,reader,schema);
    this_00[1]._vptr_ColumnReader = (_func_int **)0x0;
    this_00[1].column_schema = (ParquetColumnSchema *)0x0;
    puVar1 = &DecimalColumnReader<double,true>::vtable;
    break;
  default:
    if (schema->field_0x29 != -0x34) goto switchD_00335915_caseD_6;
    this_00 = (ColumnReader *)operator_new(0x200);
    ColumnReader::ColumnReader(this_00,reader,schema);
    this_00[1]._vptr_ColumnReader = (_func_int **)0x0;
    this_00[1].column_schema = (ParquetColumnSchema *)0x0;
    puVar1 = &DecimalColumnReader<duckdb::hugeint_t,true>::vtable;
  }
  this_00->_vptr_ColumnReader = (_func_int **)(puVar1 + 0x10);
  *(ColumnReader **)this = this_00;
  return (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)
         (unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)this;
}

Assistant:

unique_ptr<ColumnReader> CreateDecimalReaderInternal(ParquetReader &reader, const ParquetColumnSchema &schema) {
	switch (schema.type.InternalType()) {
	case PhysicalType::INT16:
		return make_uniq<DecimalColumnReader<int16_t, FIXED>>(reader, schema);
	case PhysicalType::INT32:
		return make_uniq<DecimalColumnReader<int32_t, FIXED>>(reader, schema);
	case PhysicalType::INT64:
		return make_uniq<DecimalColumnReader<int64_t, FIXED>>(reader, schema);
	case PhysicalType::INT128:
		return make_uniq<DecimalColumnReader<hugeint_t, FIXED>>(reader, schema);
	case PhysicalType::DOUBLE:
		return make_uniq<DecimalColumnReader<double, FIXED>>(reader, schema);
	default:
		throw InternalException("Unrecognized type for Decimal");
	}
}